

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImTextureID_resizeT(ImVector_ImTextureID *self,int new_size,ImTextureID v)

{
  ImTextureID local_20;
  ImTextureID v_local;
  ImVector_ImTextureID *pIStack_10;
  int new_size_local;
  ImVector_ImTextureID *self_local;
  
  local_20 = v;
  v_local._4_4_ = new_size;
  pIStack_10 = self;
  ImVector<void_*>::resize(self,new_size,&local_20);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImTextureID_resizeT(ImVector_ImTextureID* self,int new_size,const ImTextureID v)
{
    return self->resize(new_size,v);
}